

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 void *ptr,size_t size,int tag_mode)

{
  short sVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  asn_dec_rval_code_e aVar5;
  int iVar6;
  int *opt_tlv_form;
  ber_tlv_len_t *last_length;
  ssize_t sVar7;
  char *pcVar8;
  char *in_RCX;
  long *in_RDX;
  ulong extraout_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  asn_dec_rval_t aVar9;
  size_t num_3;
  size_t num_2;
  size_t num_1;
  asn_anonymous_set_ *list;
  ssize_t tag_len;
  size_t num;
  ssize_t consumed_myself;
  ber_tlv_tag_t tlv_tag;
  asn_struct_ctx_t *ctx;
  void *st;
  asn_TYPE_member_t *elm;
  asn_SET_OF_specifics_t *specs;
  asn_dec_rval_t rval;
  void *in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  ulong uVar10;
  ulong local_128;
  ulong local_f0;
  size_t local_e0;
  undefined8 in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  asn_struct_ctx_t *in_stack_ffffffffffffff60;
  asn_TYPE_descriptor_t *in_stack_ffffffffffffff68;
  asn_codec_ctx_t *in_stack_ffffffffffffff70;
  size_t local_78;
  int in_stack_ffffffffffffff90;
  ber_tlv_tag_t local_6c;
  ulong local_40;
  char *local_38;
  ulong local_18;
  size_t sStack_10;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  piVar2 = (int *)in_RSI[0x13];
  lVar3 = in_RSI[0x11];
  opt_tlv_form = (int *)*in_RDX;
  local_78 = 0;
  ASN_DEBUG("Decoding %s as SET OF",*in_RSI);
  if (opt_tlv_form == (int *)0x0) {
    opt_tlv_form = (int *)calloc(1,(long)*piVar2);
    *in_RDX = (long)opt_tlv_form;
    if (opt_tlv_form == (int *)0x0) {
      local_18 = 2;
      sStack_10 = 0;
      goto LAB_0015f091;
    }
  }
  last_length = (ber_tlv_len_t *)((long)opt_tlv_form + (long)piVar2[1]);
  sVar1 = (short)*last_length;
  if (sVar1 == 0) {
    aVar9 = ber_check_tags(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60,
                           (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff50,iVar6,in_stack_ffffffffffffff90,last_length,
                           opt_tlv_form);
    local_78 = aVar9.consumed;
    aVar5 = aVar9.code;
    local_18 = (ulong)aVar5;
    if (aVar5 != RC_OK) {
      ASN_DEBUG("%s tagging check failed: %d",*in_RSI,(ulong)aVar5);
      sStack_10 = local_78;
      goto LAB_0015f091;
    }
    if (-1 < last_length[2]) {
      last_length[2] = local_78 + last_length[2];
    }
    local_38 = in_RCX + local_78;
    local_40 = in_R8 - local_78;
    if (-1 < last_length[2]) {
      last_length[2] = last_length[2] - local_78;
    }
    ASN_DEBUG("Structure consumes %ld bytes, buffer %ld",last_length[2],local_40);
    *(short *)last_length = (short)*last_length + 1;
    *(short *)((long)last_length + 2) = 0;
  }
  else {
    local_40 = in_R8;
    local_38 = in_RCX;
    if (sVar1 != 1) {
      if (sVar1 == 2) {
LAB_0015ee90:
        do {
          if (-1 < last_length[2]) goto LAB_0015f065;
          uVar10 = local_40;
          if ((ulong)last_length[2] <= local_40) {
            uVar10 = last_length[2];
          }
          if (uVar10 < 2) {
            if ((ulong)last_length[2] <= local_40) {
              local_40 = last_length[2];
            }
            if ((local_40 == 0) || (*local_38 == '\0')) {
              local_18 = 1;
              sStack_10 = local_78;
            }
            else {
              local_18 = 2;
              sStack_10 = local_78;
            }
            goto LAB_0015f091;
          }
          if ((*local_38 != '\0') || (local_38[1] != '\0')) {
            local_18 = 2;
            sStack_10 = local_78;
            goto LAB_0015f091;
          }
          local_38 = local_38 + 2;
          local_40 = local_40 - 2;
          if (-1 < last_length[2]) {
            last_length[2] = last_length[2] + -2;
          }
          local_78 = local_78 + 2;
          last_length[2] = last_length[2] + 1;
        } while( true );
      }
      goto LAB_0015f074;
    }
  }
LAB_0015e7f8:
  if ((*last_length & 0x10000) == 0) {
    if (last_length[2] == 0) {
      ASN_DEBUG("End of SET OF %s",*in_RSI);
      *(short *)last_length = 10;
      local_18 = 0;
      sStack_10 = local_78;
      goto LAB_0015f091;
    }
    if (local_40 < (ulong)last_length[2]) {
      local_e0 = local_40;
    }
    else {
      local_e0 = last_length[2];
    }
    sVar7 = ber_fetch_tag(local_38,local_e0,&local_6c);
    if (sVar7 != -1) {
      if (sVar7 != 0) {
        if ((last_length[2] < 0) && (*local_38 == '\0')) {
          if (local_40 < (ulong)last_length[2]) {
            local_f0 = local_40;
          }
          else {
            local_f0 = last_length[2];
          }
          if (local_f0 < 2) {
            if ((last_length[2] < 0) || (local_40 < (ulong)last_length[2])) {
              local_18 = 1;
              sStack_10 = local_78;
            }
            else {
              local_18 = 2;
              sStack_10 = local_78;
            }
            goto LAB_0015f091;
          }
          if (local_38[1] == '\0') {
            *(short *)last_length = (short)*last_length + 1;
            *(short *)((long)last_length + 2) = 0;
            goto LAB_0015ee90;
          }
        }
        if ((*(int *)(lVar3 + 0xc) == -1) || (local_6c == *(ber_tlv_tag_t *)(lVar3 + 0xc))) {
          *(ushort *)((long)last_length + 2) = *(ushort *)((long)last_length + 2) | 1;
          goto LAB_0015eb02;
        }
        pcVar8 = ber_tlv_tag_string(0);
        ASN_DEBUG("Unexpected tag %s fixed SET OF %s",pcVar8,*in_RSI);
        uVar4 = *in_RSI;
        pcVar8 = ber_tlv_tag_string(0);
        ASN_DEBUG("%s SET OF has tag %s",uVar4,pcVar8);
        local_18 = 2;
        sStack_10 = local_78;
        goto LAB_0015f091;
      }
      if ((last_length[2] < 0) || (local_40 < (ulong)last_length[2])) {
        local_18 = 1;
        sStack_10 = local_78;
        goto LAB_0015f091;
      }
    }
    local_18 = 2;
    sStack_10 = local_78;
    goto LAB_0015f091;
  }
LAB_0015eb02:
  if (local_40 < (ulong)last_length[2]) {
    local_128 = local_40;
  }
  else {
    local_128 = last_length[2];
  }
  iVar6 = (**(code **)(*(long *)(lVar3 + 0x18) + 0x28))
                    (in_RDI,*(undefined8 *)(lVar3 + 0x18),last_length + 1,local_38,local_128);
  ASN_DEBUG("In %s SET OF %s code %d consumed %d",*in_RSI,**(undefined8 **)(lVar3 + 0x18),iVar6,
            extraout_RDX & 0xffffffff);
  if (iVar6 == 0) {
    iVar6 = asn_set_add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (iVar6 != 0) {
      local_18 = 2;
      sStack_10 = local_78;
      goto LAB_0015f091;
    }
    last_length[1] = 0;
  }
  else {
    if (iVar6 == 1) {
      if ((last_length[2] < 0) || (local_40 < (ulong)last_length[2])) {
        if (-1 < last_length[2]) {
          last_length[2] = last_length[2] - extraout_RDX;
        }
        sStack_10 = extraout_RDX + local_78;
        local_18 = 1;
        goto LAB_0015f091;
      }
LAB_0015ed72:
      (**(code **)(*(long *)(lVar3 + 0x18) + 0x10))(*(undefined8 *)(lVar3 + 0x18),last_length[1],0);
      last_length[1] = 0;
      local_18 = 2;
      sStack_10 = local_78;
      goto LAB_0015f091;
    }
    if (iVar6 == 2) goto LAB_0015ed72;
  }
  local_38 = local_38 + extraout_RDX;
  local_40 = local_40 - extraout_RDX;
  if (-1 < last_length[2]) {
    last_length[2] = last_length[2] - extraout_RDX;
  }
  local_78 = extraout_RDX + local_78;
  *(short *)((long)last_length + 2) = 0;
  goto LAB_0015e7f8;
LAB_0015f065:
  *(short *)last_length = 10;
LAB_0015f074:
  local_18 = 0;
  sStack_10 = local_78;
LAB_0015f091:
  aVar9.consumed = sStack_10;
  aVar9._0_8_ = local_18;
  return aVar9;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const void *ptr, size_t size, int tag_mode) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	ber_tlv_tag_t tlv_tag;	/* T from TLV */
	asn_dec_rval_t rval;	/* Return code from subparsers */

	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	ASN_DEBUG("Decoding %s as SET OF", td->name);
	
	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) {
			RETURN(RC_FAIL);
		}
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	
	/*
	 * Start to parse where left previously
	 */
	switch(ctx->phase) {
	case 0:
		/*
		 * PHASE 0.
		 * Check that the set of tags associated with given structure
		 * perfectly fits our expectations.
		 */

		rval = ber_check_tags(opt_codec_ctx, td, ctx, ptr, size,
			tag_mode, 1, &ctx->left, 0);
		if(rval.code != RC_OK) {
			ASN_DEBUG("%s tagging check failed: %d",
				td->name, rval.code);
			return rval;
		}

		if(ctx->left >= 0)
			ctx->left += rval.consumed; /* ?Substracted below! */
		ADVANCE(rval.consumed);

		ASN_DEBUG("Structure consumes %ld bytes, "
			"buffer %ld", (long)ctx->left, (long)size);

		NEXT_PHASE(ctx);
		/* Fall through */
	case 1:
		/*
		 * PHASE 1.
		 * From the place where we've left it previously,
		 * try to decode the next item.
		 */
	  for(;; ctx->step = 0) {
		ssize_t tag_len;	/* Length of TLV's T */

		if(ctx->step & 1)
			goto microphase2;

		/*
		 * MICROPHASE 1: Synchronize decoding.
		 */

		if(ctx->left == 0) {
			ASN_DEBUG("End of SET OF %s", td->name);
			/*
			 * No more things to decode.
			 * Exit out of here.
			 */
			PHASE_OUT(ctx);
			RETURN(RC_OK);
		}

		/*
		 * Fetch the T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, LEFT, &tlv_tag);
		switch(tag_len) {
		case 0: if(!SIZE_VIOLATION) RETURN(RC_WMORE);
			/* Fall through */
		case -1: RETURN(RC_FAIL);
		}

		if(ctx->left < 0 && ((const uint8_t *)ptr)[0] == 0) {
			if(LEFT < 2) {
				if(SIZE_VIOLATION)
					RETURN(RC_FAIL);
				else
					RETURN(RC_WMORE);
			} else if(((const uint8_t *)ptr)[1] == 0) {
				/*
				 * Found the terminator of the
				 * indefinite length structure.
				 */
				break;
			}
		}

		/* Outmost tag may be unknown and cannot be fetched/compared */
		if(elm->tag != (ber_tlv_tag_t)-1) {
		    if(BER_TAGS_EQUAL(tlv_tag, elm->tag)) {
			/*
			 * The new list member of expected type has arrived.
			 */
		    } else {
			ASN_DEBUG("Unexpected tag %s fixed SET OF %s",
				ber_tlv_tag_string(tlv_tag), td->name);
			ASN_DEBUG("%s SET OF has tag %s",
				td->name, ber_tlv_tag_string(elm->tag));
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * MICROPHASE 2: Invoke the member-specific decoder.
		 */
		ctx->step |= 1;		/* Confirm entering next microphase */
	microphase2:
		
		/*
		 * Invoke the member fetch routine according to member's type
		 */
		rval = elm->type->ber_decoder(opt_codec_ctx,
				elm->type, &ctx->ptr, ptr, LEFT, 0);
		ASN_DEBUG("In %s SET OF %s code %d consumed %d",
			td->name, elm->type->name,
			rval.code, (int)rval.consumed);
		switch(rval.code) {
		case RC_OK:
			{
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				else
					ctx->ptr = 0;
			}
			break;
		case RC_WMORE: /* More data expected */
			if(!SIZE_VIOLATION) {
				ADVANCE(rval.consumed);
				RETURN(RC_WMORE);
			}
			/* Fall through */
		case RC_FAIL: /* Fatal error */
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
			RETURN(RC_FAIL);
		} /* switch(rval) */
		
		ADVANCE(rval.consumed);
	  }	/* for(all list members) */

		NEXT_PHASE(ctx);
	case 2:
		/*
		 * Read in all "end of content" TLVs.
		 */
		while(ctx->left < 0) {
			if(LEFT < 2) {
				if(LEFT > 0 && ((const char *)ptr)[0] != 0) {
					/* Unexpected tag */
					RETURN(RC_FAIL);
				} else {
					RETURN(RC_WMORE);
				}
			}
			if(((const char *)ptr)[0] == 0
			&& ((const char *)ptr)[1] == 0) {
				ADVANCE(2);
				ctx->left++;
			} else {
				RETURN(RC_FAIL);
			}
		}

		PHASE_OUT(ctx);
	}
	
	RETURN(RC_OK);
}